

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_c.c
# Opt level: O2

FILE * do_fopen(char *filename)

{
  FILE *pFVar1;
  
  pFVar1 = fopen(filename,"wb");
  if (pFVar1 != (FILE *)0x0) {
    return (FILE *)pFVar1;
  }
  fprintf(_stderr,"unable to open %s\n",filename);
  exit(2);
}

Assistant:

static FILE*
do_fopen(char const* filename)
{
    FILE* f = NULL;
#ifdef _MSC_VER
    if (fopen_s(&f, filename, "wb") != 0) {
        f = NULL;
    }
#else
    f = fopen(filename, "wb");
#endif
    if (f == NULL) {
        fprintf(stderr, "unable to open %s\n", filename);
        exit(2);
    }
    return f;
}